

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSimulationIslandManager.cpp
# Opt level: O1

void __thiscall
cbtSimulationIslandManager::buildAndProcessIslands
          (cbtSimulationIslandManager *this,cbtDispatcher *dispatcher,
          cbtCollisionWorld *collisionWorld,IslandCallback *callback)

{
  cbtElement *pcVar1;
  cbtCollisionObject *pcVar2;
  cbtCollisionObject **ptr;
  cbtPersistentManifold **ppcVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  cbtCollisionObject **ppcVar7;
  long lVar8;
  long lVar9;
  cbtPersistentManifold **ppcVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  CProfileSample __profile;
  CProfileSample local_69;
  int local_68;
  cbtPersistentManifoldSortPredicate local_62;
  cbtPersistentManifoldSortPredicateDeterministic local_61;
  ulong local_60;
  uint local_58;
  int local_54;
  ulong local_50;
  cbtCollisionWorld *local_48;
  IslandCallback *local_40;
  long local_38;
  
  local_40 = callback;
  buildIslands(this,dispatcher,collisionWorld);
  local_60 = (ulong)(uint)(this->m_unionFind).m_elements.m_size;
  CProfileSample::CProfileSample(&local_69,"processIslands");
  local_48 = collisionWorld;
  if (this->m_splitIslands == false) {
    iVar17 = (*dispatcher->_vptr_cbtDispatcher[0xb])(dispatcher);
    iVar6 = (*dispatcher->_vptr_cbtDispatcher[9])(dispatcher);
    (**(code **)(*(long *)local_40 + 0x10))
              (local_40,(local_48->m_collisionObjects).m_data,(local_48->m_collisionObjects).m_size,
               iVar17,iVar6,0xffffffff);
  }
  else {
    iVar17 = (this->m_islandmanifold).m_size;
    if ((collisionWorld->m_dispatchInfo).m_deterministicOverlappingPairs == true) {
      if (1 < iVar17) {
        cbtAlignedObjectArray<cbtPersistentManifold_*>::
        quickSortInternal<cbtPersistentManifoldSortPredicateDeterministic>
                  (&this->m_islandmanifold,&local_61,0,iVar17 + -1);
      }
    }
    else if (1 < iVar17) {
      cbtAlignedObjectArray<cbtPersistentManifold_*>::
      quickSortInternal<cbtPersistentManifoldSortPredicate>
                (&this->m_islandmanifold,&local_62,0,iVar17 + -1);
    }
    if (0 < (int)local_60) {
      iVar6 = 0;
      local_58 = 1;
      local_50 = 0;
      uVar15 = local_60;
      local_38 = (long)iVar17;
      do {
        lVar18 = (long)iVar6;
        local_68 = (this->m_unionFind).m_elements.m_data[lVar18].m_id;
        local_54 = iVar6 + 1;
        if (iVar6 + 1 < (int)uVar15) {
          local_54 = (int)uVar15;
        }
        bVar4 = true;
        do {
          pcVar1 = (this->m_unionFind).m_elements.m_data;
          if (pcVar1[lVar18].m_id != local_68) {
            local_54 = (int)lVar18;
            break;
          }
          pcVar2 = (collisionWorld->m_collisionObjects).m_data[pcVar1[lVar18].m_sz];
          iVar17 = (this->m_islandBodies).m_size;
          iVar6 = (this->m_islandBodies).m_capacity;
          if (iVar17 == iVar6) {
            iVar13 = iVar17 * 2;
            if (iVar17 == 0) {
              iVar13 = 1;
            }
            if (iVar6 < iVar13) {
              if (iVar13 == 0) {
                ppcVar7 = (cbtCollisionObject **)0x0;
              }
              else {
                ppcVar7 = (cbtCollisionObject **)cbtAlignedAllocInternal((long)iVar13 << 3,0x10);
              }
              lVar8 = (long)(this->m_islandBodies).m_size;
              if (0 < lVar8) {
                lVar9 = 0;
                do {
                  ppcVar7[lVar9] = (this->m_islandBodies).m_data[lVar9];
                  lVar9 = lVar9 + 1;
                } while (lVar8 != lVar9);
              }
              ptr = (this->m_islandBodies).m_data;
              if (ptr != (cbtCollisionObject **)0x0) {
                if ((this->m_islandBodies).m_ownsMemory == true) {
                  cbtAlignedFreeInternal(ptr);
                }
                (this->m_islandBodies).m_data = (cbtCollisionObject **)0x0;
              }
              (this->m_islandBodies).m_ownsMemory = true;
              (this->m_islandBodies).m_data = ppcVar7;
              (this->m_islandBodies).m_capacity = iVar13;
              uVar15 = local_60;
              collisionWorld = local_48;
            }
          }
          iVar17 = (this->m_islandBodies).m_size;
          (this->m_islandBodies).m_data[iVar17] = pcVar2;
          (this->m_islandBodies).m_size = iVar17 + 1;
          iVar17 = pcVar2->m_activationState1;
          bVar5 = bVar4;
          if (iVar17 != 5) {
            bVar5 = false;
          }
          if (iVar17 == 2) {
            bVar5 = bVar4;
          }
          bVar4 = bVar5;
          lVar18 = lVar18 + 1;
        } while (lVar18 < (long)uVar15);
        uVar16 = (uint)local_50;
        uVar12 = (uint)local_38;
        if ((int)uVar16 < (int)uVar12) {
          ppcVar3 = (this->m_islandmanifold).m_data;
          lVar18 = (long)(int)uVar16;
          iVar17 = ppcVar3[lVar18]->m_body0->m_islandTag1;
          if (iVar17 < 0) {
            iVar17 = ppcVar3[lVar18]->m_body1->m_islandTag1;
          }
          if (iVar17 != local_68) goto LAB_008dbc63;
          ppcVar10 = ppcVar3 + lVar18;
          uVar11 = uVar16;
          uVar14 = uVar16 + 1;
          if ((int)(uVar16 + 1) < (int)uVar12) {
            uVar14 = uVar12;
          }
          do {
            lVar18 = lVar18 + 1;
            uVar12 = uVar14;
            if (local_38 <= lVar18) break;
            iVar17 = ppcVar3[lVar18]->m_body0->m_islandTag1;
            if (iVar17 < 0) {
              iVar17 = ppcVar3[lVar18]->m_body1->m_islandTag1;
            }
            uVar12 = uVar11 + 1;
            uVar15 = local_60;
            uVar11 = uVar12;
          } while (local_68 == iVar17);
          iVar17 = uVar12 - uVar16;
        }
        else {
LAB_008dbc63:
          iVar17 = 0;
          ppcVar10 = (cbtPersistentManifold **)0x0;
          uVar12 = local_58;
        }
        if (!bVar4) {
          (**(code **)(*(long *)local_40 + 0x10))
                    (local_40,(this->m_islandBodies).m_data,(this->m_islandBodies).m_size,ppcVar10,
                     iVar17,local_68);
          uVar15 = local_60;
        }
        collisionWorld = local_48;
        iVar6 = local_54;
        local_50 = local_50 & 0xffffffff;
        if (iVar17 != 0) {
          local_50 = (ulong)uVar12;
        }
        iVar17 = (this->m_islandBodies).m_size;
        lVar18 = (long)iVar17;
        local_58 = uVar12;
        if ((lVar18 < 1) && (iVar17 < 0)) {
          if ((this->m_islandBodies).m_capacity < 0) {
            ppcVar7 = (this->m_islandBodies).m_data;
            if (ppcVar7 != (cbtCollisionObject **)0x0) {
              if ((this->m_islandBodies).m_ownsMemory == true) {
                cbtAlignedFreeInternal(ppcVar7);
              }
              (this->m_islandBodies).m_data = (cbtCollisionObject **)0x0;
            }
            (this->m_islandBodies).m_ownsMemory = true;
            (this->m_islandBodies).m_data = (cbtCollisionObject **)0x0;
            (this->m_islandBodies).m_capacity = 0;
            uVar15 = local_60;
          }
          if (iVar17 < 0) {
            do {
              (this->m_islandBodies).m_data[lVar18] = (cbtCollisionObject *)0x0;
              lVar18 = lVar18 + 1;
            } while (lVar18 != 0);
          }
        }
        (this->m_islandBodies).m_size = 0;
      } while (iVar6 < (int)uVar15);
    }
  }
  CProfileSample::~CProfileSample(&local_69);
  return;
}

Assistant:

void cbtSimulationIslandManager::buildAndProcessIslands(cbtDispatcher* dispatcher, cbtCollisionWorld* collisionWorld, IslandCallback* callback)
{
	cbtCollisionObjectArray& collisionObjects = collisionWorld->getCollisionObjectArray();

	buildIslands(dispatcher, collisionWorld);

	int endIslandIndex = 1;
	int startIslandIndex;
	int numElem = getUnionFind().getNumElements();

	BT_PROFILE("processIslands");

	if (!m_splitIslands)
	{
		cbtPersistentManifold** manifold = dispatcher->getInternalManifoldPointer();
		int maxNumManifolds = dispatcher->getNumManifolds();
		callback->processIsland(&collisionObjects[0], collisionObjects.size(), manifold, maxNumManifolds, -1);
	}
	else
	{
		// Sort manifolds, based on islands
		// Sort the vector using predicate and std::sort
		//std::sort(islandmanifold.begin(), islandmanifold.end(), cbtPersistentManifoldSortPredicate);

		int numManifolds = int(m_islandmanifold.size());

		//tried a radix sort, but quicksort/heapsort seems still faster
		//@todo rewrite island management
		//cbtPersistentManifoldSortPredicateDeterministic sorts contact manifolds based on islandid,
		//but also based on object0 unique id and object1 unique id
		if (collisionWorld->getDispatchInfo().m_deterministicOverlappingPairs)
		{
			m_islandmanifold.quickSort(cbtPersistentManifoldSortPredicateDeterministic());
		}
		else
		{
			m_islandmanifold.quickSort(cbtPersistentManifoldSortPredicate());
		}

		//m_islandmanifold.heapSort(cbtPersistentManifoldSortPredicate());

		//now process all active islands (sets of manifolds for now)

		int startManifoldIndex = 0;
		int endManifoldIndex = 1;

		//int islandId;

		//	printf("Start Islands\n");

		//traverse the simulation islands, and call the solver, unless all objects are sleeping/deactivated
		for (startIslandIndex = 0; startIslandIndex < numElem; startIslandIndex = endIslandIndex)
		{
			int islandId = getUnionFind().getElement(startIslandIndex).m_id;

			bool islandSleeping = true;

			for (endIslandIndex = startIslandIndex; (endIslandIndex < numElem) && (getUnionFind().getElement(endIslandIndex).m_id == islandId); endIslandIndex++)
			{
				int i = getUnionFind().getElement(endIslandIndex).m_sz;
				cbtCollisionObject* colObj0 = collisionObjects[i];
				m_islandBodies.push_back(colObj0);
				if (colObj0->isActive())
					islandSleeping = false;
			}

			//find the accompanying contact manifold for this islandId
			int numIslandManifolds = 0;
			cbtPersistentManifold** startManifold = 0;

			if (startManifoldIndex < numManifolds)
			{
				int curIslandId = getIslandId(m_islandmanifold[startManifoldIndex]);
				if (curIslandId == islandId)
				{
					startManifold = &m_islandmanifold[startManifoldIndex];

					for (endManifoldIndex = startManifoldIndex + 1; (endManifoldIndex < numManifolds) && (islandId == getIslandId(m_islandmanifold[endManifoldIndex])); endManifoldIndex++)
					{
					}
					/// Process the actual simulation, only if not sleeping/deactivated
					numIslandManifolds = endManifoldIndex - startManifoldIndex;
				}
			}

			if (!islandSleeping)
			{
				callback->processIsland(&m_islandBodies[0], m_islandBodies.size(), startManifold, numIslandManifolds, islandId);
				//			printf("Island callback of size:%d bodies, %d manifolds\n",islandBodies.size(),numIslandManifolds);
			}

			if (numIslandManifolds)
			{
				startManifoldIndex = endManifoldIndex;
			}

			m_islandBodies.resize(0);
		}
	}  // else if(!splitIslands)
}